

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expressions.hpp
# Opt level: O2

void __thiscall TernaryReturned::TernaryReturned(TernaryReturned *this,Exception e)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  Item::Item(&this->item,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  this->exception = e;
  return;
}

Assistant:

TernaryReturned(Exception e) : item(Item("")), exception(e) {}